

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableModel::clear(QTableModel *this)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *pQVar2;
  pointer ppQVar3;
  ulong uVar4;
  
  if ((this->verticalHeaderItems).d.size != 0) {
    uVar4 = 0;
    do {
      ppQVar1 = (this->verticalHeaderItems).d.ptr;
      pQVar2 = ppQVar1[uVar4];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        pQVar2->view = (QTableWidget *)0x0;
        pQVar2 = ppQVar1[uVar4];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        ppQVar3 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
        ppQVar3[uVar4] = (QTableWidgetItem *)0x0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(this->verticalHeaderItems).d.size);
  }
  if ((this->horizontalHeaderItems).d.size != 0) {
    uVar4 = 0;
    do {
      ppQVar1 = (this->horizontalHeaderItems).d.ptr;
      pQVar2 = ppQVar1[uVar4];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        pQVar2->view = (QTableWidget *)0x0;
        pQVar2 = ppQVar1[uVar4];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        ppQVar3 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
        ppQVar3[uVar4] = (QTableWidgetItem *)0x0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(this->horizontalHeaderItems).d.size);
  }
  clearContents(this);
  return;
}

Assistant:

void QTableModel::clear()
{
    for (int j = 0; j < verticalHeaderItems.size(); ++j) {
        if (verticalHeaderItems.at(j)) {
            verticalHeaderItems.at(j)->view = nullptr;
            delete verticalHeaderItems.at(j);
            verticalHeaderItems[j] = 0;
        }
    }
    for (int k = 0; k < horizontalHeaderItems.size(); ++k) {
        if (horizontalHeaderItems.at(k)) {
            horizontalHeaderItems.at(k)->view = nullptr;
            delete horizontalHeaderItems.at(k);
            horizontalHeaderItems[k] = 0;
        }
    }
    clearContents();
}